

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_buf.cpp
# Opt level: O0

void __thiscall BufferBase::pop(BufferBase *this,int len)

{
  bool bVar1;
  Mempool *this_00;
  int len_local;
  BufferBase *this_local;
  
  bVar1 = false;
  if (this->data_buf != (Chunk *)0x0) {
    bVar1 = len <= this->data_buf->length;
  }
  if (!bVar1) {
    __assert_fail("data_buf != nullptr && len <= data_buf->length",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/data_buf.cpp"
                  ,0x19,"void BufferBase::pop(int)");
  }
  Chunk::pop(this->data_buf,len);
  if (this->data_buf->length == 0) {
    this_00 = Mempool::get_instance();
    Mempool::retrieve(this_00,this->data_buf);
    this->data_buf = (Chunk *)0x0;
  }
  return;
}

Assistant:

void BufferBase::pop(int len) 
{
    assert(data_buf != nullptr && len <= data_buf->length);

    data_buf->pop(len);
    if(data_buf->length == 0) {
        Mempool::get_instance().retrieve(data_buf);
        data_buf = nullptr;
    }
}